

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
rc::detail::(anonymous_namespace)::describeIngredient_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Ingredient *ingredient)

{
  GenerationFailure *e;
  exception *e_1;
  Ingredient *ingredient_local;
  
  tryDescribeIngredientValue_abi_cxx11_(__return_storage_ptr__,this,ingredient);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string>
describeIngredient(const gen::detail::Recipe::Ingredient &ingredient) {
  // TODO I don't know if this is the right approach with counterexamples
  // even...
  try {
    return tryDescribeIngredientValue(ingredient);
  } catch (const GenerationFailure &e) {
    return {"Generation failed", e.what()};
  } catch (const std::exception &e) {
    return {"Exception while generating", e.what()};
  } catch (...) {
    return {"Unknown exception", "<\?\?\?>"};
  }
}